

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O1

void snuff_light_source(int x,int y)

{
  ls_t *plVar1;
  obj *obj;
  boolean bVar2;
  
  plVar1 = level->lev_lights;
  do {
    if (plVar1 == (ls_t *)0x0) {
      return;
    }
    if (((plVar1->type == 0) && (plVar1->x == x)) && (plVar1->y == y)) {
      obj = (obj *)plVar1->id;
      bVar2 = obj_is_burning(obj);
      if ((bVar2 != '\0') && (bVar2 = artifact_light(obj), bVar2 == '\0')) {
        end_burn(obj,obj->otyp != 0xe9);
        return;
      }
    }
    plVar1 = plVar1->next;
  } while( true );
}

Assistant:

void snuff_light_source(int x, int y)
{
    light_source *ls;
    struct obj *obj;

    for (ls = level->lev_lights; ls; ls = ls->next)
	/*
	Is this position check valid??? Can I assume that the positions
	will always be correct because the objects would have been
	updated with the last vision update?  [Is that recent enough???]
	*/
	if (ls->type == LS_OBJECT && ls->x == x && ls->y == y) {
	    obj = (struct obj *) ls->id;
	    if (obj_is_burning(obj)) {
		/* The only way to snuff Sunsword is to unwield it.  Darkness
		 * scrolls won't affect it.  (If we got here because it was
		 * dropped or thrown inside a monster, this won't matter anyway
		 * because it will go out when dropped.)
		 */
		if (artifact_light(obj)) continue;
		end_burn(obj, obj->otyp != MAGIC_LAMP);
		/*
		 * The current ls element has just been removed (and
		 * ls->next is now invalid).  Return assuming that there
		 * is only one light source attached to each object.
		 */
		return;
	    }
	}
}